

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execShiftEa<(moira::Instr)14,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 op)

{
  bool bVar1;
  uint uVar2;
  ushort in_SI;
  Moira *in_RDI;
  Moira *unaff_retaddr;
  u32 data;
  u32 ea;
  int src;
  u32 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  u32 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  Moira *pMVar3;
  int cnt;
  
  uVar2 = in_SI & 7;
  pMVar3 = in_RDI;
  bVar1 = readOp<(moira::Mode)4,(moira::Size)2,64ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)in_RDI);
  cnt = (int)((ulong)pMVar3 >> 0x20);
  if (bVar1) {
    prefetch<0ul>(in_RDI);
    shift<(moira::Instr)14,(moira::Size)2>
              (unaff_retaddr,cnt,CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)));
    writeM<(moira::Mode)4,(moira::Size)2,4ul>
              (in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void
Moira::execShiftEa(u16 op)
{
    int src = _____________xxx(op);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    prefetch();

    writeM<M,S, POLLIPL>(ea, shift<I,S>(1, data));
}